

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCore.c
# Opt level: O1

int Sbd_ManExplore2(Sbd_Man_t *p,int Pivot,word *pTruth)

{
  uint nCol;
  Vec_Int_t *pVVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  sat_solver *psVar6;
  ulong uVar7;
  word wVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  uint nRows;
  timespec ts;
  word CoverRows [64];
  word CoverCols [64];
  word Offset [64];
  word Onset [64];
  timespec local_870;
  uint local_860;
  int local_85c;
  ulong local_858;
  word *local_850;
  long local_848;
  ulong local_840;
  ulong local_838 [64];
  word local_638 [64];
  word local_438 [64];
  word local_238 [65];
  
  uVar9 = (ulong)(uint)Pivot;
  local_850 = pTruth;
  memset(local_238,0,0x200);
  memset(local_438,0,0x200);
  memset(local_838,0,0x200);
  memset(local_638,0,0x200);
  if ((-1 < Pivot) && (Pivot < p->vObj2Var->nSize)) {
    local_85c = p->vObj2Var->pArray[uVar9];
    local_840 = (ulong)(uint)(p->vTfo->nSize + p->vWinObjs->nSize + p->vRoots->nSize);
    nCol = p->vDivVars->nSize;
    uVar5 = (ulong)nCol;
    iVar2 = clock_gettime(3,&local_870);
    if (iVar2 < 0) {
      lVar10 = 1;
    }
    else {
      lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_870.tv_nsec),8);
      lVar10 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_870.tv_sec * -1000000;
    }
    psVar6 = Sbd_ManSatSolver(p->pSat,p->pGia,p->vMirrors,Pivot,p->vWinObjs,p->vObj2Var,p->vTfo,
                              p->vRoots,0);
    p->pSat = psVar6;
    iVar2 = clock_gettime(3,&local_870);
    if (iVar2 < 0) {
      lVar11 = -1;
    }
    else {
      lVar11 = local_870.tv_nsec / 1000 + local_870.tv_sec * 1000000;
    }
    p->timeCnf = p->timeCnf + lVar11 + lVar10;
    iVar2 = clock_gettime(3,&local_870);
    if (iVar2 < 0) {
      lVar10 = 1;
    }
    else {
      lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_870.tv_nsec),8);
      lVar10 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_870.tv_sec * -1000000;
    }
    uVar3 = Sbd_ManCollectConstantsNew(p->pSat,p->vDivVars,4,local_85c,local_238,local_438);
    iVar2 = clock_gettime(3,&local_870);
    if (iVar2 < 0) {
      lVar11 = -1;
    }
    else {
      lVar11 = local_870.tv_nsec / 1000 + local_870.tv_sec * 1000000;
    }
    p->timeSat = p->timeSat + lVar11 + lVar10;
    if ((int)uVar3 < 0) {
      local_848 = (long)(int)nCol;
      lVar10 = 0;
      nRows = 0;
      local_860 = Pivot;
      do {
        uVar9 = local_238[lVar10];
        lVar11 = 0;
        do {
          if (uVar9 == local_438[lVar11]) {
            __assert_fail("Cube",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                          ,0x4b9,"int Sbd_ManExplore2(Sbd_Man_t *, int, word *)");
          }
          if (0x100 < (int)nRows) {
            __assert_fail("nRows <= nRowLimit",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                          ,0x353,"int Sbd_ManAddCube1(int, word *, int, word)");
          }
          uVar7 = local_438[lVar11] ^ uVar9;
          uVar3 = 0;
          if (0 < (int)nRows) {
            uVar12 = 0;
            do {
              uVar4 = nRows;
              if ((local_838[uVar12] & ~uVar7) == 0) goto LAB_0053a920;
              uVar12 = uVar12 + 1;
            } while (nRows != uVar12);
            if (0 < (int)nRows) {
              uVar12 = 0;
              uVar3 = 0;
              do {
                if ((uVar7 & ~local_838[uVar12]) != 0) {
                  lVar13 = (long)(int)uVar3;
                  uVar3 = uVar3 + 1;
                  local_838[lVar13] = local_838[uVar12];
                }
                uVar12 = uVar12 + 1;
              } while (nRows != uVar12);
            }
          }
          if ((int)uVar3 < 0x100) {
            lVar13 = (long)(int)uVar3;
            uVar3 = uVar3 + 1;
            local_838[lVar13] = uVar7;
          }
          uVar4 = uVar3;
          if ((int)uVar3 < (int)nRows) {
            memset(local_838 + (int)uVar3,0,(ulong)(nRows + ~uVar3) * 8 + 8);
          }
LAB_0053a920:
          nRows = uVar4;
          lVar11 = lVar11 + 1;
        } while (lVar11 != 4);
        lVar10 = lVar10 + 1;
      } while (lVar10 != 4);
      if (0x40 < (int)nRows) {
        __assert_fail("nRows <= 64",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                      ,0x4bc,"int Sbd_ManExplore2(Sbd_Man_t *, int, word *)");
      }
      if (0 < (int)nRows) {
        uVar9 = 0;
        do {
          if (-1 < (int)nCol) {
            uVar7 = local_838[uVar9];
            uVar12 = 0;
            do {
              if ((uVar7 >> (uVar12 & 0x3f) & 1) != 0) {
                local_638[(uVar9 >> 6) + uVar12] =
                     local_638[(uVar9 >> 6) + uVar12] ^ 1L << ((byte)uVar9 & 0x3f);
              }
              uVar12 = uVar12 + 1;
            } while (nCol + 1 != uVar12);
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 != nRows);
      }
      uVar3 = 0;
      if (nRows != 0x40) {
        uVar9 = 0;
        while( true ) {
          if (p->pPars->fVeryVerbose != 0) {
            Sbd_ManMatrPrint(p,local_638,nCol,nRows);
          }
          iVar2 = clock_gettime(3,&local_870);
          if (iVar2 < 0) {
            lVar10 = 1;
          }
          else {
            lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_870.tv_nsec),8);
            lVar10 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_870.tv_sec * -1000000;
          }
          iVar2 = Sbd_ManFindCands(p,local_638,nCol);
          if (iVar2 == 0) break;
          iVar2 = clock_gettime(3,&local_870);
          if (iVar2 < 0) {
            lVar11 = -1;
          }
          else {
            lVar11 = local_870.tv_nsec / 1000 + local_870.tv_sec * 1000000;
          }
          p->timeCov = p->timeCov + lVar11 + lVar10;
          local_858 = uVar9;
          if (p->pPars->fVeryVerbose != 0) {
            printf("Candidate support:  ");
            pVVar1 = p->vDivSet;
            printf("Vector has %d entries: {",(ulong)(uint)pVVar1->nSize);
            if (0 < pVVar1->nSize) {
              lVar10 = 0;
              do {
                printf(" %d",(ulong)(uint)pVVar1->pArray[lVar10]);
                lVar10 = lVar10 + 1;
              } while (lVar10 < pVVar1->nSize);
            }
            puts(" }");
          }
          iVar2 = clock_gettime(3,&local_870);
          if (iVar2 < 0) {
            lVar10 = 1;
          }
          else {
            lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_870.tv_nsec),8);
            lVar10 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_870.tv_sec * -1000000;
          }
          uVar3 = (uint)local_858;
          wVar8 = Sbd_ManSolve(p->pSat,local_85c,(int)local_840 + uVar3,p->vDivSet,p->vDivVars,
                               p->vDivValues,p->vLits);
          *local_850 = wVar8;
          iVar2 = clock_gettime(3,&local_870);
          if (iVar2 < 0) {
            lVar11 = -1;
          }
          else {
            lVar11 = local_870.tv_nsec / 1000 + local_870.tv_sec * 1000000;
          }
          p->timeSat = p->timeSat + lVar11 + lVar10;
          if (*local_850 == 0x8765432187654321) {
            if (p->pPars->fVeryVerbose != 0) {
              printf("Node %d:  SAT.\n",(ulong)local_860);
              if (0 < (int)nCol) {
                uVar9 = 0;
                do {
                  if ((long)p->vDivVars->nSize <= (long)uVar9) goto LAB_0053af4f;
                  iVar2 = p->vDivVars->pArray[uVar9];
                  if (((long)iVar2 < 0) || (p->vWinObjs->nSize <= iVar2)) goto LAB_0053af4f;
                  iVar2 = p->vWinObjs->pArray[iVar2];
                  if (((long)iVar2 < 0) || (p->vLutLevs->nSize <= iVar2)) goto LAB_0053af4f;
                  printf("%d",(ulong)(uint)p->vLutLevs->pArray[iVar2]);
                  uVar9 = uVar9 + 1;
                } while (uVar5 != uVar9);
              }
              putchar(10);
              if (0 < (int)nCol) {
                uVar7 = 0;
                uVar9 = uVar5;
                do {
                  printf("%d",(ulong)(uint)((int)uVar7 + (int)(uVar7 / 10) * -10));
                  uVar7 = (ulong)((int)uVar7 + 1);
                  uVar3 = (int)uVar9 - 1;
                  uVar9 = (ulong)uVar3;
                } while (uVar3 != 0);
              }
              putchar(10);
              if (0 < (int)nCol) {
                uVar9 = 0;
                do {
                  if ((long)p->vDivValues->nSize <= (long)uVar9) goto LAB_0053af4f;
                  uVar3 = p->vDivValues->pArray[uVar9];
                  uVar4 = 0x78;
                  if ((uVar3 & 4) != 0) {
                    uVar4 = uVar3 & 1 | 0x30;
                  }
                  putchar(uVar4);
                  uVar9 = uVar9 + 1;
                } while (uVar5 != uVar9);
              }
              putchar(10);
              if (0 < (int)nCol) {
                uVar9 = 0;
                do {
                  if ((long)p->vDivValues->nSize <= (long)uVar9) goto LAB_0053af4f;
                  uVar3 = p->vDivValues->pArray[uVar9];
                  uVar4 = uVar3 >> 1 & 1 | 0x30;
                  if ((uVar3 & 8) == 0) {
                    uVar4 = 0x78;
                  }
                  putchar(uVar4);
                  uVar9 = uVar9 + 1;
                } while (uVar5 != uVar9);
              }
              putchar(10);
              uVar3 = (uint)local_858;
            }
            if (0 < (int)nCol) {
              pVVar1 = p->vDivValues;
              uVar4 = pVVar1->nSize;
              if ((int)uVar4 < 1) {
                uVar4 = 0;
              }
              uVar9 = 0;
              do {
                if (uVar4 == uVar9) goto LAB_0053af4f;
                if (pVVar1->pArray[uVar9] - 0xdU < 2) {
                  local_638[uVar9] = local_638[uVar9] | 1L << ((byte)nRows & 0x3f);
                }
                uVar9 = uVar9 + 1;
              } while (uVar5 != uVar9);
            }
            local_638[local_848] = local_638[local_848] | 1L << ((byte)nRows & 0x3f);
            nRows = nRows + 1;
          }
          else {
            if (*local_850 != 0x1234567812345678) {
              if (p->pPars->fVeryVerbose != 0) {
                printf("Node %d:  UNSAT.   ",(ulong)local_860);
                Extra_PrintBinary(_stdout,(uint *)local_850,1 << ((byte)p->vDivSet->nSize & 0x1f));
                putchar(10);
              }
              p->nLuts[1] = p->nLuts[1] + 1;
              return 1;
            }
            printf("Node %d:  Undecided.\n",(ulong)local_860);
          }
          if (0x1e < uVar3) {
            return 0;
          }
          uVar9 = (ulong)(uVar3 + 1);
          if (0x3f < (int)nRows) {
            return 0;
          }
        }
        if (p->pPars->fVeryVerbose != 0) {
          puts("Cannot find a feasible cover.");
        }
        iVar2 = clock_gettime(3,&local_870);
        if (iVar2 < 0) {
          lVar11 = -1;
        }
        else {
          lVar11 = local_870.tv_nsec / 1000 + local_870.tv_sec * 1000000;
        }
        p->timeCov = p->timeCov + lVar11 + lVar10;
        uVar3 = 0;
      }
    }
    else {
      if (p->pPars->fVeryVerbose != 0) {
        printf("Found stuck-at-%d node %d.\n",(ulong)uVar3,uVar9);
      }
      if (p->vLutLevs->nSize <= Pivot) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      p->vLutLevs->pArray[uVar9] = 0;
      p->nLuts[0] = p->nLuts[0] + 1;
    }
    return uVar3;
  }
LAB_0053af4f:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Sbd_ManExplore2( Sbd_Man_t * p, int Pivot, word * pTruth )
{
    abctime clk;
    word Onset[64] = {0}, Offset[64] = {0}, Cube;
    word CoverRows[64] = {0}, CoverCols[64] = {0};
    int nIters, nItersMax = 32;
    int i, k, nRows = 0;

    int PivotVar = Vec_IntEntry(p->vObj2Var, Pivot);
    int FreeVar = Vec_IntSize(p->vWinObjs) + Vec_IntSize(p->vTfo) + Vec_IntSize(p->vRoots);
    int nDivs = Vec_IntSize( p->vDivVars );
    int nConsts = 4;
    int RetValue;

    clk = Abc_Clock();
    //sat_solver_delete_p( &p->pSat );
    p->pSat = Sbd_ManSatSolver( p->pSat, p->pGia, p->vMirrors, Pivot, p->vWinObjs, p->vObj2Var, p->vTfo, p->vRoots, 0 );
    p->timeCnf += Abc_Clock() - clk;

    assert( nConsts <= 8 );
    clk = Abc_Clock();
    RetValue = Sbd_ManCollectConstantsNew( p->pSat, p->vDivVars, nConsts, PivotVar, Onset, Offset );
    p->timeSat += Abc_Clock() - clk;
    if ( RetValue >= 0 )
    {
        if ( p->pPars->fVeryVerbose )
            printf( "Found stuck-at-%d node %d.\n", RetValue, Pivot );
        Vec_IntWriteEntry( p->vLutLevs, Pivot, 0 );
        p->nLuts[0]++;
        return RetValue;
    }
    RetValue = 0;

    // create rows of the table
    nRows = 0;
    for ( i = 0; i < nConsts; i++ )
    for ( k = 0; k < nConsts; k++ )
    {
        Cube = Onset[i] ^ Offset[k];
        assert( Cube );
        nRows = Sbd_ManAddCube1( 256, CoverRows, nRows, Cube );
    }
    assert( nRows <= 64 );
    
    // create columns of the table
    for ( i = 0; i < nRows; i++ )
        for ( k = 0; k <= nDivs; k++ )
            if ( (CoverRows[i] >> k) & 1 )
                Abc_TtXorBit(&CoverCols[k], i);

    // solve the covering problem
    for ( nIters = 0; nIters < nItersMax && nRows < 64; nIters++ )
    {
        if ( p->pPars->fVeryVerbose )
            Sbd_ManMatrPrint( p, CoverCols, nDivs, nRows );

        clk = Abc_Clock();
        if ( !Sbd_ManFindCands( p, CoverCols, nDivs ) )
        {
            if ( p->pPars->fVeryVerbose )
                printf( "Cannot find a feasible cover.\n" );
            p->timeCov += Abc_Clock() - clk;
            return 0;
        }
        p->timeCov += Abc_Clock() - clk;

        if ( p->pPars->fVeryVerbose )
            printf( "Candidate support:  " ),
            Vec_IntPrint( p->vDivSet );

        clk = Abc_Clock();
        *pTruth = Sbd_ManSolve( p->pSat, PivotVar, FreeVar+nIters, p->vDivSet, p->vDivVars, p->vDivValues, p->vLits );
        p->timeSat += Abc_Clock() - clk;

        if ( *pTruth == SBD_SAT_UNDEC )
            printf( "Node %d:  Undecided.\n", Pivot );
        else if ( *pTruth == SBD_SAT_SAT )
        {
            if ( p->pPars->fVeryVerbose )
            {
                int i;
                printf( "Node %d:  SAT.\n", Pivot );
                for ( i = 0; i < nDivs; i++ )
                    printf( "%d", Vec_IntEntry(p->vLutLevs, Vec_IntEntry(p->vWinObjs, Vec_IntEntry(p->vDivVars, i))) );
                printf( "\n" );
                for ( i = 0; i < nDivs; i++ )
                    printf( "%d", i % 10 );
                printf( "\n" );
                for ( i = 0; i < nDivs; i++ )
                    printf( "%c", (Vec_IntEntry(p->vDivValues, i) & 0x4) ? '0' + (Vec_IntEntry(p->vDivValues, i) & 1) : 'x' );
                printf( "\n" );
                for ( i = 0; i < nDivs; i++ )
                    printf( "%c", (Vec_IntEntry(p->vDivValues, i) & 0x8) ? '0' + ((Vec_IntEntry(p->vDivValues, i) >> 1) & 1) : 'x' );
                printf( "\n" );
            }
            // add row to the covering table
            for ( i = 0; i < nDivs; i++ )
                if ( Vec_IntEntry(p->vDivValues, i) == 0xE || Vec_IntEntry(p->vDivValues, i) == 0xD )
                    CoverCols[i] |= ((word)1 << nRows);
            CoverCols[nDivs] |= ((word)1 << nRows);
            nRows++;
        }
        else
        {
            if ( p->pPars->fVeryVerbose )
            {
                printf( "Node %d:  UNSAT.   ", Pivot );
                Extra_PrintBinary( stdout, (unsigned *)pTruth, 1 << Vec_IntSize(p->vDivSet) ), printf( "\n" );
            }
            p->nLuts[1]++;
            RetValue = 1;
            break;
        }
    }
    return RetValue;
}